

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O0

void __thiscall cmStateDirectory::SetCurrentSource(cmStateDirectory *this,string *dir)

{
  PointerType pBVar1;
  allocator<char> local_61;
  string local_60;
  string local_40;
  string *local_20;
  string *loc;
  string *dir_local;
  cmStateDirectory *this_local;
  
  loc = dir;
  dir_local = (string *)this;
  pBVar1 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  local_20 = &pBVar1->Location;
  std::__cxx11::string::operator=((string *)local_20,(string *)loc);
  cmsys::SystemTools::ConvertToUnixSlashes(local_20);
  cmsys::SystemTools::CollapseFullPath(&local_40,local_20);
  std::__cxx11::string::operator=((string *)local_20,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  ComputeRelativePathTopSource(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"CMAKE_CURRENT_SOURCE_DIR",&local_61);
  cmStateSnapshot::SetDefinition(&this->Snapshot_,&local_60,local_20);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  return;
}

Assistant:

void cmStateDirectory::SetCurrentSource(std::string const& dir)
{
  std::string& loc = this->DirectoryState->Location;
  loc = dir;
  cmSystemTools::ConvertToUnixSlashes(loc);
  loc = cmSystemTools::CollapseFullPath(loc);

  this->ComputeRelativePathTopSource();

  this->Snapshot_.SetDefinition("CMAKE_CURRENT_SOURCE_DIR", loc);
}